

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

Upvaldesc * allocupvalue(FuncState *fs)

{
  byte bVar1;
  Proto *pPVar2;
  Upvaldesc *pUVar3;
  int local_1c;
  int oldsize;
  Proto *f;
  FuncState *fs_local;
  
  pPVar2 = fs->f;
  local_1c = pPVar2->sizeupvalues;
  checklimit(fs,fs->nups + 1,0xff,"upvalues");
  pUVar3 = (Upvaldesc *)
           luaM_growaux_(fs->ls->L,pPVar2->upvalues,(uint)fs->nups,&pPVar2->sizeupvalues,0x10,0xff,
                         "upvalues");
  pPVar2->upvalues = pUVar3;
  while (local_1c < pPVar2->sizeupvalues) {
    pPVar2->upvalues[local_1c].name = (TString *)0x0;
    local_1c = local_1c + 1;
  }
  pUVar3 = pPVar2->upvalues;
  bVar1 = fs->nups;
  fs->nups = bVar1 + 1;
  return pUVar3 + bVar1;
}

Assistant:

static Upvaldesc *allocupvalue (FuncState *fs) {
  Proto *f = fs->f;
  int oldsize = f->sizeupvalues;
  checklimit(fs, fs->nups + 1, MAXUPVAL, "upvalues");
  luaM_growvector(fs->ls->L, f->upvalues, fs->nups, f->sizeupvalues,
                  Upvaldesc, MAXUPVAL, "upvalues");
  while (oldsize < f->sizeupvalues)
    f->upvalues[oldsize++].name = NULL;
  return &f->upvalues[fs->nups++];
}